

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void emit_GLSL_SGE(Context *ctx)

{
  uint uVar1;
  char local_118 [8];
  char code [128];
  char src1 [64];
  char src0 [64];
  int vecsize;
  Context *ctx_local;
  
  uVar1 = vecsize_from_writemask((ctx->dest_arg).writemask);
  make_GLSL_srcarg_string_masked(ctx,0,src1 + 0x38,0x40);
  make_GLSL_srcarg_string_masked(ctx,1,code + 0x78,0x40);
  if (uVar1 == 1) {
    make_GLSL_destarg_assign(ctx,local_118,0x80,"float(%s >= %s)",src1 + 0x38,code + 0x78);
  }
  else {
    make_GLSL_destarg_assign
              (ctx,local_118,0x80,"vec%d(greaterThanEqual(%s, %s))",(ulong)uVar1,src1 + 0x38,
               code + 0x78);
  }
  output_line(ctx,"%s",local_118);
  return;
}

Assistant:

static void emit_GLSL_SGE(Context *ctx)
{
    const int vecsize = vecsize_from_writemask(ctx->dest_arg.writemask);
    char src0[64]; make_GLSL_srcarg_string_masked(ctx, 0, src0, sizeof (src0));
    char src1[64]; make_GLSL_srcarg_string_masked(ctx, 1, src1, sizeof (src1));
    char code[128];

    // float(bool) or vec(bvec) results in 0.0 or 1.0, like SGE wants.
    if (vecsize == 1)
    {
        make_GLSL_destarg_assign(ctx, code, sizeof (code),
                                 "float(%s >= %s)", src0, src1);
    } // if
    else
    {
        make_GLSL_destarg_assign(ctx, code, sizeof (code),
                                 "vec%d(greaterThanEqual(%s, %s))",
                                 vecsize, src0, src1);
    } // else
    output_line(ctx, "%s", code);
}